

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall
Catch::Generators::anon_unknown_3::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
  *p_Var1;
  pointer puVar2;
  _func_int **pp_Var3;
  bool bVar4;
  uint uVar5;
  int extraout_EAX;
  int iVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  GeneratorUntypedBase *pGVar7;
  undefined7 extraout_var_06;
  ITracker *pIVar8;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  _Var9;
  long lVar10;
  undefined4 in_register_00000034;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  long lVar11;
  _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
  *this_00;
  GeneratorTracker *pGVar12;
  unique_ptr<Catch::TestCaseTracking::ITracker> *child;
  _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
  *p_Var13;
  pointer this_01;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  __it._M_current =
       (unique_ptr<Catch::TestCaseTracking::ITracker> *)CONCAT44(in_register_00000034,__fd);
  uVar5 = TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  _Var9._M_current = (StringRef *)(ulong)uVar5;
  this_00 = (_Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
             *)(this->super_TrackerBase).super_ITracker.m_children.
               super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
            *)(this->super_TrackerBase).super_ITracker.m_children.
              super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == p_Var1) {
LAB_00167c02:
    bVar4 = false;
  }
  else {
    lVar11 = (long)p_Var1 - (long)this_00;
    for (lVar10 = lVar11 >> 5; 0 < lVar10; lVar10 = lVar10 + -1) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var,bVar4);
      p_Var13 = this_00;
      if (bVar4) goto LAB_00167bfc;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00 + 8,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var_00,bVar4);
      p_Var13 = this_00 + 8;
      if (bVar4) goto LAB_00167bfc;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00 + 0x10,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var_01,bVar4);
      p_Var13 = this_00 + 0x10;
      if (bVar4) goto LAB_00167bfc;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00 + 0x18,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var_02,bVar4);
      p_Var13 = this_00 + 0x18;
      if (bVar4) goto LAB_00167bfc;
      this_00 = this_00 + 0x20;
      lVar11 = lVar11 + -0x20;
    }
    lVar11 = lVar11 >> 3;
    if (lVar11 == 1) {
LAB_00167beb:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var_05,bVar4);
      p_Var13 = p_Var1;
      if (bVar4) {
        p_Var13 = this_00;
      }
    }
    else if (lVar11 == 2) {
LAB_00167bd6:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
              ::operator()(this_00,__it);
      _Var9._M_current = (StringRef *)CONCAT71(extraout_var_04,bVar4);
      p_Var13 = this_00;
      if (!bVar4) {
        this_00 = this_00 + 8;
        goto LAB_00167beb;
      }
    }
    else {
      p_Var13 = p_Var1;
      if (lVar11 == 3) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::{lambda()#1}::operator()()const::{lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)#1}>
                ::operator()(this_00,__it);
        _Var9._M_current = (StringRef *)CONCAT71(extraout_var_03,bVar4);
        p_Var13 = this_00;
        if (!bVar4) {
          this_00 = this_00 + 8;
          goto LAB_00167bd6;
        }
      }
    }
LAB_00167bfc:
    pGVar12 = this;
    if (p_Var13 !=
        (_Iter_pred<Catch::Generators::(anonymous_namespace)::GeneratorTracker::close()::_lambda()_1_::operator()()const::_lambda(Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>const&)_1_>
         *)(this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00167c02;
    do {
      pGVar12 = (GeneratorTracker *)(pGVar12->super_TrackerBase).super_ITracker.m_parent;
      iVar6 = (*(pGVar12->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pGVar12);
    } while ((char)iVar6 == '\0');
    _Var9._M_current = (StringRef *)(pGVar12->super_IGeneratorTracker)._vptr_IGeneratorTracker;
    if ((GeneratorUntypedBase *)_Var9._M_current == (pGVar12->m_generator).m_ptr) {
      if ((this->m_generator).m_ptr == (GeneratorUntypedBase *)0x0) goto LAB_00167ce0;
      goto LAB_00167c19;
    }
    puVar2 = (this->super_TrackerBase).super_ITracker.m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (this->super_TrackerBase).super_ITracker.m_children.
                   super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar4 = this_01 != puVar2, bVar4;
        this_01 = this_01 + 1) {
      pIVar8 = Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator->(this_01);
      uVar5 = (*pIVar8->_vptr_ITracker[5])(pIVar8);
      _Var9._M_current = (StringRef *)(ulong)uVar5;
      if ((char)uVar5 != '\0') {
        pp_Var3 = (pGVar12->super_IGeneratorTracker)._vptr_IGeneratorTracker;
        pGVar7 = (pGVar12->m_generator).m_ptr;
        pIVar8 = Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator*(this_01);
        local_40 = *(undefined4 *)((long)&pIVar8[1].m_nameAndLocation.name.field_2 + 8);
        uStack_3c = *(undefined4 *)((long)&pIVar8[1].m_nameAndLocation.name.field_2 + 0xc);
        uStack_38 = *(undefined4 *)&pIVar8[1].m_nameAndLocation.location.file;
        uStack_34 = *(undefined4 *)((long)&pIVar8[1].m_nameAndLocation.location.file + 4);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<Catch::StringRef_const*,std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::StringRef_const>>
                          (pp_Var3,pGVar7,&local_40);
        if ((GeneratorUntypedBase *)_Var9._M_current != (pGVar12->m_generator).m_ptr) break;
      }
    }
  }
  if ((this->m_generator).m_ptr == (GeneratorUntypedBase *)0x0) {
LAB_00167ce0:
    __assert_fail("m_generator && \"Tracker without generator\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1459,
                  "virtual void Catch::Generators::(anonymous namespace)::GeneratorTracker::close()"
                 );
  }
  if (!bVar4) {
    if ((this->super_TrackerBase).super_ITracker.m_runState != CompletedSuccessfully) {
      return (int)_Var9._M_current;
    }
    pGVar7 = Catch::Detail::unique_ptr<Catch::Generators::GeneratorUntypedBase>::operator->
                       (&this->m_generator);
    bVar4 = GeneratorUntypedBase::countedNext(pGVar7);
    if (!bVar4) {
      return (int)CONCAT71(extraout_var_06,bVar4);
    }
  }
LAB_00167c19:
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).super_ITracker.m_children);
  (this->super_TrackerBase).super_ITracker.m_runState = Executing;
  return extraout_EAX;
}

Assistant:

void close() override {
                    TrackerBase::close();
                    // If a generator has a child (it is followed by a section)
                    // and none of its children have started, then we must wait
                    // until later to start consuming its values.
                    // This catches cases where `GENERATE` is placed between two
                    // `SECTION`s.
                    // **The check for m_children.empty cannot be removed**.
                    // doing so would break `GENERATE` _not_ followed by
                    // `SECTION`s.
                    const bool should_wait_for_child = [&]() {
                        // No children -> nobody to wait for
                        if ( m_children.empty() ) { return false; }
                        // If at least one child started executing, don't wait
                        if ( std::find_if(
                                 m_children.begin(),
                                 m_children.end(),
                                 []( TestCaseTracking::ITrackerPtr const&
                                         tracker ) {
                                     return tracker->hasStarted();
                                 } ) != m_children.end() ) {
                            return false;
                        }

                        // No children have started. We need to check if they
                        // _can_ start, and thus we should wait for them, or
                        // they cannot start (due to filters), and we shouldn't
                        // wait for them
                        ITracker* parent = m_parent;
                        // This is safe: there is always at least one section
                        // tracker in a test case tracking tree
                        while ( !parent->isSectionTracker() ) {
                            parent = parent->parent();
                        }
                        assert( parent &&
                                "Missing root (test case) level section" );

                        auto const& parentSection =
                            static_cast<SectionTracker const&>( *parent );
                        auto const& filters = parentSection.getFilters();
                        // No filters -> no restrictions on running sections
                        if ( filters.empty() ) { return true; }

                        for ( auto const& child : m_children ) {
                            if ( child->isSectionTracker() &&
                                 std::find( filters.begin(),
                                            filters.end(),
                                            static_cast<SectionTracker const&>(
                                                *child )
                                                .trimmedName() ) !=
                                     filters.end() ) {
                                return true;
                            }
                        }
                        return false;
                    }();

                    // This check is a bit tricky, because m_generator->next()
                    // has a side-effect, where it consumes generator's current
                    // value, but we do not want to invoke the side-effect if
                    // this generator is still waiting for any child to start.
                    assert( m_generator && "Tracker without generator" );
                    if ( should_wait_for_child ||
                         ( m_runState == CompletedSuccessfully &&
                           m_generator->countedNext() ) ) {
                        m_children.clear();
                        m_runState = Executing;
                    }
                }